

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

DisasJumpType op_stm(DisasContext_conflict13 *s,DisasOps *o)

{
  uint uVar1;
  int iVar2;
  TCGContext_conflict12 *tcg_ctx;
  TCGv_i64 val;
  TCGv_i64 addr;
  uint uVar3;
  TCGv_i64 pTVar4;
  uint uVar5;
  
  uVar5 = (s->fields).presentO;
  if (((uVar5 & 1) != 0) && ((uVar5 & 4) != 0)) {
    tcg_ctx = s->uc->tcg_ctx;
    uVar5 = (s->fields).c[0];
    uVar1 = (s->fields).c[2];
    iVar2 = (int)s->insn->data;
    pTVar4 = tcg_const_i64_s390x(tcg_ctx,(long)iVar2);
    while( true ) {
      val = tcg_ctx->regs[(int)uVar5];
      addr = o->in2;
      uVar3 = get_mem_index(s);
      tcg_gen_qemu_st_i64_s390x(tcg_ctx,val,addr,(ulong)uVar3,iVar2 == 8 | MO_BEUL);
      if (uVar5 == uVar1) break;
      tcg_gen_op3_s390x(tcg_ctx,INDEX_op_add_i64,(TCGArg)(o->in2 + (long)tcg_ctx),
                        (TCGArg)(o->in2 + (long)tcg_ctx),(TCGArg)(pTVar4 + (long)tcg_ctx));
      uVar5 = uVar5 + 1 & 0xf;
    }
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
    return DISAS_NEXT;
  }
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static bool op_stm(DisasContext *s, arg_ldst_block *a, int min_n)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int i, j, n, list, mem_idx;
    bool user = a->u;
    TCGv_i32 addr, tmp, tmp2;

    if (user) {
        /* STM (user) */
        if (IS_USER(s)) {
            /* Only usable in supervisor mode.  */
            unallocated_encoding(s);
            return true;
        }
    }

    list = a->list;
    n = ctpop16(list);
    if (n < min_n || a->rn == 15) {
        unallocated_encoding(s);
        return true;
    }

    addr = op_addr_block_pre(s, a, n);
    mem_idx = get_mem_index(s);

    for (i = j = 0; i < 16; i++) {
        if (!(list & (1 << i))) {
            continue;
        }

        if (user && i != 15) {
            tmp = tcg_temp_new_i32(tcg_ctx);
            tmp2 = tcg_const_i32(tcg_ctx, i);
            gen_helper_get_user_reg(tcg_ctx, tmp, tcg_ctx->cpu_env, tmp2);
            tcg_temp_free_i32(tcg_ctx, tmp2);
        } else {
            tmp = load_reg(s, i);
        }
        gen_aa32_st32(s, tmp, addr, mem_idx);
        tcg_temp_free_i32(tcg_ctx, tmp);

        /* No need to add after the last transfer.  */
        if (++j != n) {
            tcg_gen_addi_i32(tcg_ctx, addr, addr, 4);
        }
    }

    op_addr_block_post(s, a, addr, n);
    return true;
}